

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::generateFilterFederate(CommonCore *this)

{
  _Rb_tree_header *p_Var1;
  GlobalFederateId fedID;
  int iVar2;
  pointer pcVar3;
  _Alloc_hider __src;
  FilterFederate *pFVar4;
  pthread_t pVar5;
  uint *puVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  _Any_data local_1c0;
  code *local_1b0;
  code *local_1a8;
  _Any_data local_1a0;
  code *local_190;
  code *local_188;
  _Any_data local_180;
  code *local_170;
  code *local_168;
  _Any_data local_160;
  code *local_150;
  code *local_148;
  _Any_data local_140;
  code *local_130;
  code *local_128;
  _Any_data local_120;
  code *local_110;
  code *local_108;
  _Any_data local_100;
  code *local_f0;
  code *local_e8;
  ActionMessage local_e0;
  
  fedID.gid = (this->filterFedID)._M_i.gid;
  pFVar4 = (FilterFederate *)operator_new(0x4c0);
  pcVar3 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar3,
             pcVar3 + (this->super_BrokerBase).identifier._M_string_length);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_1e0,"_filters");
  FilterFederate::FilterFederate
            (pFVar4,fedID,(string *)&local_1e0,
             (GlobalBrokerId)(this->super_BrokerBase).global_broker_id_local.gid,&this->super_Core);
  this->filterFed = pFVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    pFVar4 = this->filterFed;
  }
  pVar5 = pthread_self();
  LOCK();
  (this->filterThread)._M_i._M_thread = pVar5;
  UNLOCK();
  LOCK();
  (this->filterFedID)._M_i.gid = fedID.gid;
  UNLOCK();
  local_180._8_8_ = 0;
  local_168 = std::
              _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3887:29)>
              ::_M_invoke;
  local_170 = std::
              _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3887:29)>
              ::_M_manager;
  local_1a0._8_8_ = 0;
  local_188 = std::
              _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3888:29)>
              ::_M_invoke;
  local_190 = std::
              _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3888:29)>
              ::_M_manager;
  local_1c0._8_8_ = 0;
  local_1a8 = std::
              _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3891:29)>
              ::_M_invoke;
  local_1b0 = std::
              _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3891:29)>
              ::_M_manager;
  local_100._8_8_ = 0;
  local_e8 = std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3892:29)>
             ::_M_invoke;
  local_f0 = std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3892:29)>
             ::_M_manager;
  local_1c0._M_unused._M_object = this;
  local_1a0._M_unused._M_object = this;
  local_180._M_unused._M_object = this;
  local_100._M_unused._M_object = this;
  FilterFederate::setCallbacks
            (pFVar4,(function<void_(const_helics::ActionMessage_&)> *)&local_180,
             (function<void_(helics::ActionMessage_&&)> *)&local_1a0,
             (function<void_(const_helics::ActionMessage_&)> *)&local_1c0,
             (function<void_(helics::ActionMessage_&&)> *)&local_100);
  if (local_f0 != (code *)0x0) {
    (*local_f0)((_Any_data *)&local_100,(_Any_data *)&local_100,__destroy_functor);
  }
  if (local_1b0 != (code *)0x0) {
    (*local_1b0)((_Any_data *)&local_1c0,(_Any_data *)&local_1c0,__destroy_functor);
  }
  if (local_190 != (code *)0x0) {
    (*local_190)((_Any_data *)&local_1a0,(_Any_data *)&local_1a0,__destroy_functor);
  }
  if (local_170 != (code *)0x0) {
    (*local_170)((_Any_data *)&local_180,(_Any_data *)&local_180,__destroy_functor);
  }
  (this->super_BrokerBase).hasFilters = true;
  pFVar4 = this->filterFed;
  pFVar4->mHandles = &this->loopHandles;
  local_120._8_8_ = 0;
  local_108 = std::
              _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3896:26)>
              ::_M_invoke;
  local_110 = std::
              _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3896:26)>
              ::_M_manager;
  local_120._M_unused._M_object = this;
  std::
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator=(&pFVar4->mLogger,
              (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)&local_120);
  if (local_110 != (code *)0x0) {
    (*local_110)((_Any_data *)&local_120,(_Any_data *)&local_120,__destroy_functor);
  }
  local_140._8_8_ = 0;
  local_128 = std::
              _Function_handler<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3899:35)>
              ::_M_invoke;
  local_130 = std::
              _Function_handler<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3899:35)>
              ::_M_manager;
  local_140._M_unused._M_object = this;
  std::function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>::
  operator=(&this->filterFed->mGetAirLock,
            (function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
             *)&local_140);
  if (local_130 != (code *)0x0) {
    (*local_130)((_Any_data *)&local_140,(_Any_data *)&local_140,__destroy_functor);
  }
  local_160._8_8_ = 0;
  local_148 = std::
              _Function_handler<void_(helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3900:27)>
              ::_M_invoke;
  local_150 = std::
              _Function_handler<void_(helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3900:27)>
              ::_M_manager;
  local_160._M_unused._M_object = this;
  std::function<void_(helics::ActionMessage_&)>::operator=
            (&this->filterFed->mDeliverMessage,
             (function<void_(helics::ActionMessage_&)> *)&local_160);
  if (local_150 != (code *)0x0) {
    (*local_150)((_Any_data *)&local_160,(_Any_data *)&local_160,__destroy_functor);
  }
  ActionMessage::ActionMessage(&local_e0,cmd_reg_fed);
  local_e0.flags._1_1_ = local_e0.flags._1_1_ | 0xc0;
  local_e0.dest_id.gid = 0;
  local_e0.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  pcVar3 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  local_e0.dest_handle.hid = fedID.gid;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,pcVar3,
             pcVar3 + (this->super_BrokerBase).identifier._M_string_length);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_200,"_filters");
  __src._M_p = local_200._M_dataplus._M_p;
  if (local_e0.payload.heap == (byte *)local_200._M_dataplus._M_p) {
    local_e0.payload.bufferSize = local_200._M_string_length;
  }
  else {
    SmallBuffer::reserve(&local_e0.payload,local_200._M_string_length);
    local_e0.payload.bufferSize = local_200._M_string_length;
    if (local_200._M_string_length != 0) {
      memcpy(local_e0.payload.heap,__src._M_p,local_200._M_string_length);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  p_Var8 = (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  puVar6 = &parent_route_id;
  if (p_Var8 != (_Base_ptr)0x0) {
    iVar2 = (this->super_BrokerBase).higher_broker_id.gid;
    p_Var1 = &(this->routing_table)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    do {
      if (iVar2 <= (int)p_Var8[1]._M_color) {
        p_Var7 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < iVar2];
    } while (p_Var8 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var7 != p_Var1) {
      puVar6 = &parent_route_id;
      if ((int)p_Var7[1]._M_color <= iVar2) {
        puVar6 = (uint *)&p_Var7[1].field_0x4;
      }
    }
  }
  (*(this->super_Core)._vptr_Core[0x6b])(this,(ulong)*puVar6,&local_e0);
  if ((this->super_BrokerBase).globalTime == true) {
    pFVar4 = this->filterFed;
    pFVar4->usingGlobalTime = true;
    (pFVar4->mCoord).globalTime = true;
  }
  ActionMessage::~ActionMessage(&local_e0);
  return;
}

Assistant:

void CommonCore::generateFilterFederate()
{
    auto fid = filterFedID.load();

    filterFed = new FilterFederate(fid, getIdentifier() + "_filters", global_broker_id_local, this);
    filterThread.store(std::this_thread::get_id());
    filterFedID.store(fid);

    filterFed->setCallbacks([this](const ActionMessage& message) { addActionMessage(message); },
                            [this](ActionMessage&& message) {
                                addActionMessage(std::move(message));
                            },
                            [this](const ActionMessage& message) { routeMessage(message); },
                            [this](ActionMessage&& message) { routeMessage(std::move(message)); });
    hasFilters = true;

    filterFed->setHandleManager(&loopHandles);
    filterFed->setLogger([this](int level, std::string_view name, std::string_view message) {
        sendToLogger(global_broker_id_local, level, name, message);
    });
    filterFed->setAirLockFunction([this](int index) { return std::ref(dataAirlocks[index]); });
    filterFed->setDeliver([this](ActionMessage& message) { deliverMessage(message); });
    ActionMessage newFed(CMD_REG_FED);
    setActionFlag(newFed, child_flag);
    setActionFlag(newFed, non_counting_flag);
    newFed.dest_id = parent_broker_id;
    newFed.source_id = global_broker_id_local;
    newFed.setExtraData(fid.baseValue());
    newFed.name(getIdentifier() + "_filters");
    transmit(getRoute(higher_broker_id), newFed);
    if (globalTime) {
        filterFed->useGlobalTimeCoordinator(true);
    }
}